

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

void xmlBufferFree(xmlBufferPtr buf)

{
  xmlBufferPtr buf_local;
  
  if (buf != (xmlBufferPtr)0x0) {
    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
      (*xmlFree)(buf->contentIO);
    }
    else {
      (*xmlFree)(buf->content);
    }
    (*xmlFree)(buf);
  }
  return;
}

Assistant:

void
xmlBufferFree(xmlBufferPtr buf) {
    if (buf == NULL)
	return;

    if (buf->alloc == XML_BUFFER_ALLOC_IO)
        xmlFree(buf->contentIO);
    else
        xmlFree(buf->content);

    xmlFree(buf);
}